

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Importer.cpp
# Opt level: O3

void SetMaterialTextureProperty
               (vector<int,_std::allocator<int>_> *embeddedTexIdxs,Asset *param_2,TextureInfo prop,
               aiMaterial *mat,aiTextureType texType,uint texSlot)

{
  Texture *pTVar1;
  vector<glTF2::Image_*,_std::allocator<glTF2::Image_*>_> *pvVar2;
  vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *pvVar3;
  byte bVar4;
  int iVar5;
  char *pcVar6;
  long lVar7;
  int iVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  aiTextureMapMode wrapT;
  aiTextureMapMode wrapS;
  aiString uri;
  aiString id;
  aiString name;
  uint local_c44;
  uint local_c40;
  aiString local_c3c;
  aiString local_838;
  aiString local_434;
  
  if (prop.texture.vector != (vector<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_> *)0x0) {
    pTVar1 = ((prop.texture.vector)->
             super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
             super__Vector_impl_data._M_start[prop.texture.index];
    pvVar2 = (pTVar1->source).vector;
    if (pvVar2 != (vector<glTF2::Image_*,_std::allocator<glTF2::Image_*>_> *)0x0) {
      uVar10 = (ulong)(pTVar1->source).index;
      lVar7 = *(long *)(*(long *)&(pvVar2->
                                  super__Vector_base<glTF2::Image_*,_std::allocator<glTF2::Image_*>_>
                                  )._M_impl + uVar10 * 8);
      uVar11 = *(ulong *)(lVar7 + 0x58);
      sVar9 = 0x3ff;
      if ((uVar11 & 0xfffffc00) == 0) {
        sVar9 = uVar11 & 0xffffffff;
      }
      local_c3c.length = (ai_uint32)sVar9;
      memcpy(local_c3c.data,*(void **)(lVar7 + 0x50),sVar9);
      local_c3c.data[sVar9] = '\0';
      iVar5 = (embeddedTexIdxs->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar10];
      if (iVar5 != -1) {
        local_c3c.data[0] = '*';
        if (iVar5 < 0) {
          pcVar6 = local_c3c.data + 2;
          local_c3c.data[1] = '-';
          iVar5 = -iVar5;
          local_c3c.length = 2;
        }
        else {
          pcVar6 = local_c3c.data + 1;
          local_c3c.length = 1;
        }
        iVar8 = 1000000000;
        bVar4 = 0;
        do {
          bVar12 = (int)((long)iVar5 / (long)iVar8) != 0;
          bVar13 = iVar8 == 1;
          if ((bool)(bVar4 | bVar13 | bVar12)) {
            *pcVar6 = (char)((long)iVar5 / (long)iVar8) + '0';
            pcVar6 = pcVar6 + 1;
            local_c3c.length = local_c3c.length + 1;
            iVar5 = iVar5 % iVar8;
            if (iVar8 == 1) break;
          }
          iVar8 = iVar8 / 10;
          bVar4 = bVar4 | bVar13 | bVar12;
        } while (local_c3c.length < 0x3ff);
        *pcVar6 = '\0';
      }
      aiMaterial::AddProperty(mat,&local_c3c,"$tex.file",texType,texSlot);
      aiMaterial::AddBinaryProperty
                (mat,&prop.texCoord,4,"$tex.file.texCoord",texType,texSlot,aiPTI_Buffer);
      pTVar1 = ((prop.texture.vector)->
               super__Vector_base<glTF2::Texture_*,_std::allocator<glTF2::Texture_*>_>)._M_impl.
               super__Vector_impl_data._M_start[prop.texture.index];
      pvVar3 = (pTVar1->sampler).vector;
      if (pvVar3 != (vector<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_> *)0x0) {
        uVar11 = (ulong)(pTVar1->sampler).index;
        lVar7 = *(long *)(*(long *)&(pvVar3->
                                    super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                    )._M_impl + uVar11 * 8);
        sVar9 = *(ulong *)(lVar7 + 0x38) & 0xffffffff;
        if ((*(ulong *)(lVar7 + 0x38) & 0xfffffc00) != 0) {
          sVar9 = 0x3ff;
        }
        local_434.length = (ai_uint32)sVar9;
        memcpy(local_434.data,*(void **)(lVar7 + 0x30),sVar9);
        local_434.data[sVar9] = '\0';
        sVar9 = 0x3ff;
        if ((*(ulong *)(lVar7 + 0x18) & 0xfffffc00) == 0) {
          sVar9 = *(ulong *)(lVar7 + 0x18) & 0xffffffff;
        }
        local_838.length = (ai_uint32)sVar9;
        memcpy(local_838.data,*(void **)(lVar7 + 0x10),sVar9);
        local_838.data[sVar9] = '\0';
        aiMaterial::AddProperty(mat,&local_434,"$tex.mappingname",texType,texSlot);
        aiMaterial::AddProperty(mat,&local_838,"$tex.mappingid",texType,texSlot);
        lVar7 = *(long *)(*(long *)&(pvVar3->
                                    super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                    )._M_impl + uVar11 * 8);
        iVar5 = *(int *)(lVar7 + 0x58);
        local_c40 = (uint)(iVar5 == 0x812f);
        if (iVar5 == 0x8370) {
          local_c40 = 2;
        }
        iVar5 = *(int *)(lVar7 + 0x5c);
        local_c44 = (uint)(iVar5 == 0x812f);
        if (iVar5 == 0x8370) {
          local_c44 = 2;
        }
        aiMaterial::AddBinaryProperty(mat,&local_c40,4,"$tex.mapmodeu",texType,texSlot,aiPTI_Buffer)
        ;
        aiMaterial::AddBinaryProperty(mat,&local_c44,4,"$tex.mapmodev",texType,texSlot,aiPTI_Buffer)
        ;
        lVar7 = *(long *)(*(long *)&(pvVar3->
                                    super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                    )._M_impl + uVar11 * 8);
        if (*(int *)(lVar7 + 0x50) != 0) {
          aiMaterial::AddBinaryProperty
                    (mat,(void *)(lVar7 + 0x50),4,"$tex.mappingfiltermag",texType,texSlot,
                     aiPTI_Buffer);
          lVar7 = *(long *)(*(long *)&(pvVar3->
                                      super__Vector_base<glTF2::Sampler_*,_std::allocator<glTF2::Sampler_*>_>
                                      )._M_impl + uVar11 * 8);
        }
        if (*(int *)(lVar7 + 0x54) != 0) {
          aiMaterial::AddBinaryProperty
                    (mat,(void *)(lVar7 + 0x54),4,"$tex.mappingfiltermin",texType,texSlot,
                     aiPTI_Buffer);
        }
      }
    }
  }
  return;
}

Assistant:

static inline void SetFace(aiFace& face, int a, int b)
{
    face.mNumIndices = 2;
    face.mIndices = new unsigned int[2];
    face.mIndices[0] = a;
    face.mIndices[1] = b;
}